

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::enumAdjust
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,size_t n)

{
  int iVar1;
  reference this_00;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  const_reference pvVar2;
  ostream *poVar3;
  const_reference pvVar4;
  string *msg;
  size_type in_RSI;
  ostringstream oss;
  int result;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *v;
  Symbol *s;
  ostringstream local_1a0 [360];
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x2181ed);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x21820e);
  this_01 = Symbol::
            extrap<std::pair<std::vector<int,std::allocator<int>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((Symbol *)0x21821b);
  std::vector<int,_std::allocator<int>_>::size(&this_01->first);
  assertLessThan(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this_01->first,in_RSI);
  iVar1 = *pvVar2;
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,"Cannot resolve symbol: ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this_01->second,~(long)iVar1);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    msg = (string *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    Exception::Exception((Exception *)poVar3,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x21839b);
  return (long)iVar1;
}

Assistant:

size_t enumAdjust(size_t n) {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sEnumAdjust, s.kind());
        const std::pair<std::vector<int>, std::vector<std::string> >* v =
            s.extrap<std::pair<std::vector<int>, std::vector<std::string> > >();
        assertLessThan(n, v->first.size());

        int result = v->first[n];
        if (result < 0) {
            std::ostringstream oss;
            oss << "Cannot resolve symbol: " << v->second[-result - 1]
                << std::endl;
            throw Exception(oss.str());
        }
        parsingStack.pop();
        return result;
    }